

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_kernel kernel)

{
  char *fmt;
  char *pcVar1;
  cl_kernel in_RDI;
  cl_int ret;
  cl_int local_4;
  
  if (in_RDI == (cl_kernel)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pReleaseKernel)(in_RDI);
    fmt = kErrorTemplate;
    if (local_4 != 0) {
      pcVar1 = OclError::toString(local_4);
      Log::print(ERR,fmt,pcVar1,kReleaseKernel);
    }
  }
  return local_4;
}

Assistant:

cl_int xmrig::OclLib::release(cl_kernel kernel) noexcept
{
    assert(pReleaseKernel != nullptr);

    if (kernel == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~kernel %s", kernel, getUint(kernel, CL_KERNEL_REFERENCE_COUNT), getString(kernel, CL_KERNEL_FUNCTION_NAME).data());

    const cl_int ret = pReleaseKernel(kernel);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseKernel);
    }

    return ret;
}